

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O1

void __thiscall
actorpp::ActorThread<PingPong>::ActorThread<actorpp::Channel<int>&>
          (ActorThread<PingPong> *this,Channel<int> *args)

{
  Channel<int> local_28;
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  
  local_28.impl.super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (args->impl).
           super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.impl.super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (args->impl).
       super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_28.impl.
      super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.impl.
       super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_28.impl.
            super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.impl.
       super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_28.impl.
            super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  PingPong::PingPong(&this->super_PingPong,&local_28);
  if (local_28.impl.
      super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.impl.
               super___shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_18.this = this;
  std::thread::
  thread<actorpp::ActorThread<PingPong>::ActorThread<actorpp::Channel<int>&>(actorpp::Channel<int>&)::_lambda()_1_,,void>
            (&this->thread,&local_18);
  return;
}

Assistant:

ActorThread(Args &&...args)
      : ActorT(std::forward<Args>(args)...), thread([&] { this->run(); }) {}